

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.c
# Opt level: O2

exr_result_t exr_compress_chunk(exr_encode_pipeline_t *encode)

{
  exr_const_context_t_conflict p_Var1;
  exr_priv_part_t p_Var2;
  void *pvVar3;
  uint64_t uVar4;
  size_t sVar5;
  exr_result_t eVar6;
  int iVar7;
  size_t sVar8;
  size_t newsz;
  ulong uVar9;
  char *pcVar10;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE_00;
  ulong in_bytes;
  exr_result_t eStack_60;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if ((encode == (exr_encode_pipeline_t *)0x0) ||
     (p_Var1 = encode->context, p_Var1 == (exr_const_context_t_conflict)0x0)) {
    return 2;
  }
  uVar9 = (ulong)encode->part_index;
  if (((long)uVar9 < 0) || (p_Var1->num_parts <= encode->part_index)) {
    UNRECOVERED_JUMPTABLE_00 = p_Var1->print_error;
    pcVar10 = "Part index (%d) out of range";
    eStack_60 = 4;
  }
  else {
    in_bytes = (encode->chunk).unpacked_size;
    if (in_bytes < encode->packed_bytes) {
      in_bytes = encode->packed_bytes;
    }
    p_Var2 = p_Var1->parts[uVar9];
    sVar8 = exr_compress_max_buffer_size(in_bytes);
    eVar6 = internal_encode_alloc_buffer
                      (encode,EXR_TRANSCODE_BUFFER_COMPRESSED,&encode->compressed_buffer,
                       &encode->compressed_alloc_size,sVar8);
    if (eVar6 != 0) {
      UNRECOVERED_JUMPTABLE_00 = p_Var1->print_error;
      sVar8 = exr_compress_max_buffer_size(in_bytes);
      eVar6 = (*UNRECOVERED_JUMPTABLE_00)
                        (p_Var1,eVar6,"error allocating buffer %zu",sVar8,UNRECOVERED_JUMPTABLE_00);
      return eVar6;
    }
    if (encode->sample_count_table != (int32_t *)0x0) {
      sVar8 = (long)(encode->chunk).height * (long)(encode->chunk).width * 4;
      if (p_Var2->comp_type == EXR_COMPRESSION_NONE) {
        internal_encode_free_buffer
                  (encode,EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,&encode->packed_sample_count_table,
                   &encode->packed_sample_count_alloc_size);
        encode->packed_sample_count_table = encode->sample_count_table;
        encode->packed_sample_count_alloc_size = 0;
        encode->packed_sample_count_bytes = sVar8;
      }
      else {
        pvVar3 = encode->packed_buffer;
        uVar4 = encode->packed_bytes;
        sVar5 = encode->packed_alloc_size;
        newsz = exr_compress_max_buffer_size(sVar8);
        eVar6 = internal_encode_alloc_buffer
                          (encode,EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,
                           &encode->packed_sample_count_table,
                           &encode->packed_sample_count_alloc_size,newsz);
        if (eVar6 != 0) {
          return eVar6;
        }
        encode->packed_buffer = encode->packed_sample_count_table;
        encode->packed_bytes = sVar8;
        encode->packed_alloc_size = encode->packed_sample_count_alloc_size;
        if (p_Var2->comp_type - EXR_COMPRESSION_ZIPS < 2) {
          iVar7 = internal_exr_apply_zip(encode);
        }
        else if (p_Var2->comp_type == EXR_COMPRESSION_RLE) {
          iVar7 = internal_exr_apply_rle(encode);
        }
        else {
          iVar7 = 3;
        }
        local_48 = (undefined4)uVar4;
        uStack_44 = (undefined4)(uVar4 >> 0x20);
        uStack_40 = (undefined4)sVar5;
        uStack_3c = (undefined4)(sVar5 >> 0x20);
        encode->packed_buffer = pvVar3;
        *(undefined4 *)&encode->packed_bytes = local_48;
        *(undefined4 *)((long)&encode->packed_bytes + 4) = uStack_44;
        *(undefined4 *)&encode->packed_alloc_size = uStack_40;
        *(undefined4 *)((long)&encode->packed_alloc_size + 4) = uStack_3c;
        if (iVar7 != 0) {
          eVar6 = (*p_Var1->print_error)
                            (p_Var1,iVar7,"Unable to compress sample table",p_Var1->print_error);
          return eVar6;
        }
      }
    }
    uVar9 = (ulong)p_Var2->comp_type;
    switch(uVar9) {
    case 0:
      eVar6 = (*p_Var1->report_error)(p_Var1,3,"no compression set but still trying to compress");
      return eVar6;
    case 1:
      eVar6 = internal_exr_apply_rle(encode);
      return eVar6;
    case 2:
    case 3:
      eVar6 = internal_exr_apply_zip(encode);
      return eVar6;
    case 4:
      eVar6 = internal_exr_apply_piz(encode);
      return eVar6;
    case 5:
      eVar6 = internal_exr_apply_pxr24(encode);
      return eVar6;
    case 6:
      eVar6 = internal_exr_apply_b44(encode);
      return eVar6;
    case 7:
      eVar6 = internal_exr_apply_b44a(encode);
      return eVar6;
    case 8:
      eVar6 = internal_exr_apply_dwaa(encode);
      return eVar6;
    case 9:
      eVar6 = internal_exr_apply_dwab(encode);
      return eVar6;
    default:
      UNRECOVERED_JUMPTABLE_00 = p_Var1->print_error;
      pcVar10 = "Compression technique 0x%02X invalid";
      eStack_60 = 3;
    }
  }
  eVar6 = (*UNRECOVERED_JUMPTABLE_00)(p_Var1,eStack_60,pcVar10,uVar9,UNRECOVERED_JUMPTABLE_00);
  return eVar6;
}

Assistant:

exr_result_t
exr_compress_chunk (exr_encode_pipeline_t* encode)
{
    exr_result_t    rv;
    exr_context_t   ctxt;
    exr_priv_part_t part;
    size_t          maxbytes;

    if (!encode) return EXR_ERR_MISSING_CONTEXT_ARG;
    ctxt = (exr_context_t) encode->context;
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    /* TODO: Double check need for a lock? */
    if (encode->part_index < 0 || encode->part_index >= ctxt->num_parts)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
            "Part index (%d) out of range",
            encode->part_index);

    part = ctxt->parts[encode->part_index];

    maxbytes = encode->chunk.unpacked_size;
    if (encode->packed_bytes > maxbytes)
        maxbytes = encode->packed_bytes;

    rv = internal_encode_alloc_buffer (
        encode,
        EXR_TRANSCODE_BUFFER_COMPRESSED,
        &(encode->compressed_buffer),
        &(encode->compressed_alloc_size),
        exr_compress_max_buffer_size (maxbytes));
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->print_error (
            ctxt,
            rv,
            "error allocating buffer %zu",
            exr_compress_max_buffer_size (maxbytes));
    //return rv;

    if (encode->sample_count_table)
    {
        uint64_t sampsize =
            (((uint64_t) encode->chunk.width) *
             ((uint64_t) encode->chunk.height));

        sampsize *= sizeof (int32_t);

        if (part->comp_type == EXR_COMPRESSION_NONE)
        {
            internal_encode_free_buffer (
                encode,
                EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,
                &(encode->packed_sample_count_table),
                &(encode->packed_sample_count_alloc_size));

            encode->packed_sample_count_table      = encode->sample_count_table;
            encode->packed_sample_count_alloc_size = 0;
            encode->packed_sample_count_bytes = sampsize;
        }
        else
        {
            void *pb;
            size_t pbb, pas;

            pb = encode->packed_buffer;
            pbb = encode->packed_bytes;
            pas = encode->packed_alloc_size;

            rv = internal_encode_alloc_buffer (
                encode,
                EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,
                &(encode->packed_sample_count_table),
                &(encode->packed_sample_count_alloc_size),
                exr_compress_max_buffer_size (sampsize));
            if (rv != EXR_ERR_SUCCESS)
                return rv;

            encode->packed_buffer = encode->packed_sample_count_table;
            encode->packed_bytes = sampsize;
            encode->packed_alloc_size = encode->packed_sample_count_alloc_size;
            switch (part->comp_type)
            {
                case EXR_COMPRESSION_NONE: rv = EXR_ERR_INVALID_ARGUMENT; break;
                case EXR_COMPRESSION_RLE: rv = internal_exr_apply_rle (encode); break;
                case EXR_COMPRESSION_ZIP:
                case EXR_COMPRESSION_ZIPS: rv = internal_exr_apply_zip (encode); break;

                default:
                    rv = EXR_ERR_INVALID_ARGUMENT;
                    break;
            }
            encode->packed_buffer = pb;
            encode->packed_bytes = pbb;
            encode->packed_alloc_size = pas;

            if (rv != EXR_ERR_SUCCESS)
                return ctxt->print_error (
                    ctxt,
                    rv,
                    "Unable to compress sample table");
        }
    }

    switch (part->comp_type)
    {
        case EXR_COMPRESSION_NONE:
            return ctxt->report_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "no compression set but still trying to compress");

        case EXR_COMPRESSION_RLE: rv = internal_exr_apply_rle (encode); break;
        case EXR_COMPRESSION_ZIP:
        case EXR_COMPRESSION_ZIPS: rv = internal_exr_apply_zip (encode); break;
        case EXR_COMPRESSION_PIZ: rv = internal_exr_apply_piz (encode); break;
        case EXR_COMPRESSION_PXR24:
            rv = internal_exr_apply_pxr24 (encode);
            break;
        case EXR_COMPRESSION_B44: rv = internal_exr_apply_b44 (encode); break;
        case EXR_COMPRESSION_B44A: rv = internal_exr_apply_b44a (encode); break;
        case EXR_COMPRESSION_DWAA: rv = internal_exr_apply_dwaa (encode); break;
        case EXR_COMPRESSION_DWAB: rv = internal_exr_apply_dwab (encode); break;
        case EXR_COMPRESSION_LAST_TYPE:
        default:
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Compression technique 0x%02X invalid",
                (int) part->comp_type);
    }
    return rv;
}